

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetTics(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  DObject *this;
  DObject *this_00;
  void *pvVar2;
  DPSprite *pDVar3;
  bool bVar4;
  bool local_66;
  bool local_63;
  DPSprite *pspr;
  int tics_to_set;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1658,
                  "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1658,
                  "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_63 = true;
  if (this != (DObject *)0x0) {
    local_63 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1658,
                  "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1658,
                  "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar4 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
    bVar4 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar4) {
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_66 = true;
    if (this_00 != (DObject *)0x0) {
      local_66 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_66 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1658,
                    "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1658,
                    "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (param[2].field_0.field_3.Type == '\x03') {
      pvVar2 = param[2].field_0.field_1.a;
      if (numparam < 4) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1659,
                      "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
        ;
      }
      if (param[3].field_0.field_3.Type == '\0') {
        iVar1 = param[3].field_0.i;
        if (((this[0xe]._vptr_DObject == (_func_int **)0x0) || (pvVar2 == (void *)0x0)) ||
           (*(int *)((long)pvVar2 + 8) != 1)) {
          if ((pvVar2 == (void *)0x0) || (*(int *)((long)pvVar2 + 8) == 0)) {
            *(int *)&this[10].Class = iVar1;
          }
        }
        else {
          pDVar3 = player_t::FindPSprite
                             ((player_t *)this[0xe]._vptr_DObject,*(int *)((long)pvVar2 + 0xc));
          if (pDVar3 != (DPSprite *)0x0) {
            pDVar3->Tics = iVar1;
          }
        }
        return 0;
      }
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1659,
                    "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1658,
                  "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1658,
                "int AF_AActor_A_SetTics(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTics)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(tics_to_set);

	if (ACTION_CALL_FROM_PSPRITE())
	{
		DPSprite *pspr = self->player->FindPSprite(stateinfo->mPSPIndex);
		if (pspr != nullptr)
		{
			pspr->Tics = tics_to_set;
			return 0;
		}
	}
	else if (ACTION_CALL_FROM_ACTOR())
	{
		// Just set tics for self.
		self->tics = tics_to_set;
	}
	// for inventory state chains this needs to be ignored.
	return 0;
}